

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

double __thiscall pugi::xpath_query::evaluate_number(xpath_query *this,xpath_node *n)

{
  double dVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  xpath_context c;
  xpath_stack_data sd;
  
  if ((undefined8 *)this->_impl == (undefined8 *)0x0) {
    uVar3 = 0;
    uVar4 = 0x7ff80000;
  }
  else {
    c.n._node._root = (n->_node)._root;
    c.n._attribute._attr = (n->_attribute)._attr;
    c.position = 1;
    sd.result._error = &sd.oom;
    sd.result._root = sd.blocks;
    sd.result._root_size = 0;
    sd.stack.temp = &sd.temp;
    sd.temp._root = sd.blocks + 1;
    sd.temp._root_size = 0;
    sd.oom = false;
    sd.blocks[1].next = (xpath_memory_block *)0x0;
    c.size = 1;
    sd.blocks[0].next = (xpath_memory_block *)0x0;
    sd.stack.result = &sd.result;
    sd.blocks[1].capacity = 0x1000;
    sd.blocks[0].capacity = 0x1000;
    sd.temp._error = sd.result._error;
    dVar1 = impl::anon_unknown_0::xpath_ast_node::eval_number(*this->_impl,&c,&sd.stack);
    if (sd.oom == true) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = std::__cxx11::string::resize;
      __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    impl::anon_unknown_0::xpath_stack_data::~xpath_stack_data(&sd);
    uVar3 = SUB84(dVar1,0);
    uVar4 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  return (double)CONCAT44(uVar4,uVar3);
}

Assistant:

PUGI_IMPL_FN double xpath_query::evaluate_number(const xpath_node& n) const
	{
		if (!_impl) return impl::gen_nan();

		impl::xpath_context c(n, 1, 1);
		impl::xpath_stack_data sd;

		double r = static_cast<impl::xpath_query_impl*>(_impl)->root->eval_number(c, sd.stack);

		if (sd.oom)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			return impl::gen_nan();
		#else
			throw std::bad_alloc();
		#endif
		}

		return r;
	}